

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TImage.cpp
# Opt level: O2

void __thiscall TUPU::TImage::setBinary(TImage *this,void *buf,size_t buf_len,string *filename)

{
  void *__dest;
  
  this->m_len = buf_len;
  std::__cxx11::string::_M_assign((string *)&this->m_filename);
  __dest = malloc(buf_len);
  this->m_buffer = __dest;
  memcpy(__dest,buf,buf_len);
  (this->m_url)._M_string_length = 0;
  *(this->m_url)._M_dataplus._M_p = '\0';
  (this->m_path)._M_string_length = 0;
  *(this->m_path)._M_dataplus._M_p = '\0';
  return;
}

Assistant:

void TImage::setBinary(const void * buf, size_t buf_len, const string & filename)
{
    m_len = buf_len;
    m_filename = filename;
    m_buffer = std::malloc(buf_len);
    memcpy(m_buffer, buf, buf_len);

    m_url.clear();
    m_path.clear();
}